

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

shared_ptr<Map_Item> __thiscall Map::GetItem(Map *this,short uid)

{
  short sVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined6 in_register_00000032;
  long *plVar2;
  long *plVar3;
  shared_ptr<Map_Item> sVar4;
  
  sVar1 = (short)in_RDX._M_pi;
  plVar3 = (long *)(CONCAT62(in_register_00000032,uid) + 0x68);
  plVar2 = plVar3;
  while (plVar2 = (long *)*plVar2, plVar2 != plVar3) {
    std::__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)this,
               (__shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2> *)(plVar2 + 2));
    in_RDX._M_pi = extraout_RDX;
    if ((short)this->world->last_character_id == sVar1) goto LAB_0017bfd9;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->id);
    in_RDX._M_pi = extraout_RDX_00;
  }
  this->world = (World *)0x0;
  this->id = 0;
  this->rid[0] = '\0';
  this->rid[1] = '\0';
  this->rid[2] = '\0';
  this->rid[3] = '\0';
  this->pk = false;
  this->field_0xf = 0;
LAB_0017bfd9:
  sVar4.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar4.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Map_Item>)sVar4.super___shared_ptr<Map_Item,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Map_Item> Map::GetItem(short uid)
{
	UTIL_FOREACH(this->items, item)
	{
		if (item->uid == uid)
		{
			return item;
		}
	}

	return std::shared_ptr<Map_Item>();
}